

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::RuleTests_numTargetTokensLex_Test::TestBody(RuleTests_numTargetTokensLex_Test *this)

{
  char *in_RCX;
  char *message;
  string_view line;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  AssertHelper local_f0;
  AssertionResult gtest_ar;
  AlignedSentencePair asp;
  PhrasalRule rule;
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"a c e\tb d f\t0-0 1-1 2-2";
  readAlignedSentencePair<false,false>(&asp,(thrax *)0x17,line);
  PhrasalRule::PhrasalRule(&rule,&asp);
  local_f8.ptr_._0_4_ = 3;
  local_f0.data_._0_4_ = PhrasalRule::numTokens<false>(&rule);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"3","rule.numTokens<false>()",(int *)&local_f8,(int *)&local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/rule_test.cpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AlignedSentencePair::~AlignedSentencePair(&asp);
  return;
}

Assistant:

TEST(RuleTests, numTargetTokensLex) {
  auto asp = readAlignedSentencePair<false, false>("a c e\tb d f\t0-0 1-1 2-2");
  PhrasalRule rule{asp};
  EXPECT_EQ(3, rule.numTokens<false>());
}